

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::IsLetConstGlobal
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId)

{
  bool bVar1;
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  
  local_20 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar1 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_20,
                     (SimpleDictionaryPropertyDescriptor<int> **)&propertyRecord);
  if ((!bVar1) ||
     (bVar1 = true,
     ((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject & 0x1000) == 0)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsLetConstGlobal(DynamicObject* instance, PropertyId propertyId)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor) && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            return true;
        }
        return false;
    }